

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void luigi(dw_rom *rom)

{
  dw_rom *rom_local;
  
  vpatch(rom,0x1415,0xf,2,0xc5,2,0xc6,2,199,2,0xc4,2,200,2,0xc9,2,0xca,2);
  vpatch(rom,0x1515,0xf,2,0xcb,2,0xcc,2,0xcd,2,0xce,2,0xcf,2,0xd0,2,0xd1,2);
  vpatch(rom,0x1615,0xf,2,0xd3,2,0xd4,2,0xd5,2,0xd6,2,0xd3,2,0xd7,2,0x92,2);
  vpatch(rom,0x1715,0xf,2,0xd1,2,0xd2,2,0xd3,2,0xd4,2,0xd5,2,0xd6,2,0xd7,2);
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4,3);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8,3);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1a8b,3,0x36,0x2a,0xc);
  vpatch(rom,0x12300,0x80,7,8,0x10,0x3f,0x7f,0x7f,0x3f,0x1f,7,0xf,0x1f,0x32,0x52,0x44,0x27,0x18,0xe0
         ,0x10,8,0xfc,0xfe,0xfe,0xfc,0xf8,0xe0,0xf0,0xf8,0x4c,0x4a,0x22,0xe4,0x18,0x3f,0x3c,0x3e,
         0x1f,0x1f,0xf,8,7,0x27,0x27,0x3f,0x1d,0x1f,0xf,0xf,7,0xe8,0x3c,0x7c,0xf8,0xf8,0x88,0xf0,0,
         0xf8,0xe4,0xe4,0xb8,0xf8,0xf8,0xf0,0,7,8);
  vpatch(rom,0x12400,0x180,3,0x1c,0x20,0x1f,0x3f,0x3f,0x1f,0xf,3,0x1f,0x3f,0x1d,0x21,0x22,0x1f,8,
         0xe0,0x10,8,0xf8,0xfc,0xfc,0xf8,0xf8,0xe0,0xf0,0xf8,0x38,100,100,0x18,0x38,0x1c,0x29,0x6f,
         0x7f,0x27,0x23,0x11,0xe,0x1f,0x3f,0x5f,0x56,0x3f,0x3f,0x1f,0xe,0xc6,0x87,0xcf,0xfe,0xfc,
         0xf2,0x22,0x1c,0xfe,0xf9,0xf1,0xf2,0xfc,0xfe,0x3e,0x1c,0,7);
  if ((rom->flags[0xe] & 8) != 0) {
    set_text(rom,0x7e56,anon_var_dwarf_809);
  }
  return;
}

Assistant:

static void luigi(dw_rom *rom)
{
    vpatch(rom, 0x01415,   15,  0x02,  0xc5,  0x02,  0xc6,  0x02,  0xc7,  0x02,  0xc4,  0x02,  0xc8,  0x02,  0xc9,  0x02,  0xca,  0x02);
    vpatch(rom, 0x01515,   15,  0x02,  0xcb,  0x02,  0xcc,  0x02,  0xcd,  0x02,  0xce,  0x02,  0xcf,  0x02,  0xd0,  0x02,  0xd1,  0x02);
    vpatch(rom, 0x01615,   15,  0x02,  0xd3,  0x02,  0xd4,  0x02,  0xd5,  0x02,  0xd6,  0x02,  0xd3,  0x02,  0xd7,  0x02,  0x92,  0x02);
    vpatch(rom, 0x01715,   15,  0x02,  0xd1,  0x02,  0xd2,  0x02,  0xd3,  0x02,  0xd4,  0x02,  0xd5,  0x02,  0xd6,  0x02,  0xd7,  0x02);
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x2a,  0x0c);
    vpatch(rom, 0x12300,  128,  0x07,  0x08,  0x10,  0x3f,  0x7f,  0x7f,  0x3f,  0x1f,  0x07,  0x0f,  0x1f,  0x32,  0x52,  0x44,  0x27,  0x18,  0xe0,  0x10,  0x08,  0xfc,  0xfe,  0xfe,  0xfc,  0xf8,  0xe0,  0xf0,  0xf8,  0x4c,  0x4a,  0x22,  0xe4,  0x18,  0x3f,  0x3c,  0x3e,  0x1f,  0x1f,  0x0f,  0x08,  0x07,  0x27,  0x27,  0x3f,  0x1d,  0x1f,  0x0f,  0x0f,  0x07,  0xe8,  0x3c,  0x7c,  0xf8,  0xf8,  0x88,  0xf0,  0x00,  0xf8,  0xe4,  0xe4,  0xb8,  0xf8,  0xf8,  0xf0,  0x00,  0x07,  0x08,  0x10,  0x3f,  0x7f,  0x7f,  0x3f,  0x1f,  0x07,  0x0f,  0x1f,  0x32,  0x52,  0x44,  0x27,  0x18,  0xe0,  0x10,  0x08,  0xfc,  0xfe,  0xfe,  0xfc,  0xf8,  0xe0,  0xf0,  0xf8,  0x4c,  0x4a,  0x22,  0xe4,  0x18,  0x17,  0x3c,  0x3e,  0x1f,  0x1f,  0x11,  0x0f,  0x00,  0x1f,  0x27,  0x27,  0x1d,  0x1f,  0x1f,  0x0f,  0x00,  0xfc,  0x3c,  0x7c,  0xf8,  0xf8,  0xf0,  0x10,  0xe0,  0xe4,  0xe4,  0xfc,  0xb8,  0xf8,  0xf0,  0xf0,  0xe0);
    vpatch(rom, 0x12400,  384,  0x03,  0x1c,  0x20,  0x1f,  0x3f,  0x3f,  0x1f,  0x0f,  0x03,  0x1f,  0x3f,  0x1d,  0x21,  0x22,  0x1f,  0x08,  0xe0,  0x10,  0x08,  0xf8,  0xfc,  0xfc,  0xf8,  0xf8,  0xe0,  0xf0,  0xf8,  0x38,  0x64,  0x64,  0x18,  0x38,  0x1c,  0x29,  0x6f,  0x7f,  0x27,  0x23,  0x11,  0x0e,  0x1f,  0x3f,  0x5f,  0x56,  0x3f,  0x3f,  0x1f,  0x0e,  0xc6,  0x87,  0xcf,  0xfe,  0xfc,  0xf2,  0x22,  0x1c,  0xfe,  0xf9,  0xf1,  0xf2,  0xfc,  0xfe,  0x3e,  0x1c,  0x00,  0x07,  0x18,  0x20,  0x1f,  0x3f,  0x3f,  0x1f,  0x00,  0x07,  0x1f,  0x3f,  0x1d,  0x21,  0x22,  0x1f,  0x00,  0xe0,  0x10,  0x08,  0xf8,  0xfc,  0xfc,  0xf8,  0x00,  0xe0,  0xf0,  0xf8,  0x38,  0x64,  0x64,  0x18,  0x0f,  0x04,  0x09,  0x0f,  0x0f,  0x0e,  0x04,  0x07,  0x08,  0x07,  0x0f,  0x0f,  0x0d,  0x0f,  0x07,  0x07,  0xf0,  0xc8,  0x84,  0x84,  0xf8,  0x38,  0x10,  0xf0,  0x30,  0xf8,  0xfc,  0xfc,  0x88,  0xc8,  0xf0,  0xf0,  0x00,  0x07,  0x08,  0x10,  0x1f,  0x3f,  0x3f,  0x1f,  0x00,  0x07,  0x0f,  0x1f,  0x1c,  0x26,  0x26,  0x18,  0x00,  0xe0,  0x18,  0x04,  0xf8,  0xfc,  0xfc,  0xf8,  0x00,  0xe0,  0xf8,  0xfc,  0xb8,  0x84,  0x44,  0xf8,  0x0f,  0x13,  0x21,  0x21,  0x1f,  0x1c,  0x08,  0x0f,  0x0c,  0x1f,  0x3f,  0x3f,  0x11,  0x13,  0x0f,  0x0f,  0xf0,  0x20,  0x90,  0xf0,  0xf0,  0x70,  0x20,  0xe0,  0x10,  0xe0,  0xf0,  0xf0,  0xb0,  0xf0,  0xe0,  0xe0,  0x07,  0x08,  0x10,  0x1f,  0x3f,  0x3f,  0x1f,  0x1f,  0x07,  0x0f,  0x1f,  0x1c,  0x26,  0x26,  0x18,  0x1c,  0xc0,  0x38,  0x04,  0xf8,  0xfc,  0xfc,  0xf8,  0xf0,  0xc0,  0xf8,  0xfc,  0xb8,  0x84,  0x44,  0xf8,  0x10,  0x63,  0xe1,  0xf3,  0x7f,  0x3f,  0x4f,  0x44,  0x38,  0x7f,  0x9f,  0x8f,  0x4f,  0x3f,  0x7f,  0x7c,  0x38,  0x38,  0x94,  0xf6,  0xfe,  0xe4,  0xc4,  0x88,  0x70,  0xf8,  0xfc,  0xfa,  0x6a,  0xfc,  0xfc,  0xf8,  0x70,  0x00,  0x03,  0x0c,  0x10,  0x30,  0x78,  0x7f,  0x3f,  0x00,  0x03,  0x0f,  0x1f,  0x3f,  0x5f,  0x4f,  0x27,  0x00,  0xc0,  0x30,  0x08,  0x0c,  0x1e,  0xfe,  0xfc,  0x00,  0xc0,  0xf0,  0xf8,  0xfc,  0xfa,  0xf2,  0xe4,  0x1f,  0x17,  0x3c,  0x3e,  0x1f,  0x0f,  0x08,  0x07,  0x18,  0x1f,  0x27,  0x27,  0x1f,  0x0f,  0x0f,  0x07,  0xf8,  0xfc,  0x3c,  0x78,  0xf8,  0x88,  0xf0,  0x00,  0x18,  0xe4,  0xe4,  0xf8,  0xf8,  0xf8,  0xf0,  0x00,  0x00,  0x03,  0x0c,  0x10,  0x30,  0x78,  0x7f,  0x3f,  0x00,  0x03,  0x0f,  0x1f,  0x3f,  0x5f,  0x4f,  0x27,  0x00,  0xc0,  0x30,  0x08,  0x0c,  0x1e,  0xfe,  0xfc,  0x00,  0xc0,  0xf0,  0xf8,  0xfc,  0xfa,  0xf2,  0xe4,  0x1f,  0x3f,  0x3c,  0x1e,  0x1f,  0x11,  0x0f,  0x00,  0x18,  0x27,  0x27,  0x1f,  0x1f,  0x1f,  0x0f,  0x00,  0xf8,  0xe8,  0x3c,  0x7c,  0xf8,  0xf0,  0x10,  0xe0,  0x18,  0xf8,  0xe4,  0xe4,  0xf8,  0xf0,  0xf0,  0xe0);
    if (CUSTOM_SPELLS(rom)) {
        set_text(rom, 0x7e56, "PILL\xff"
                              "JUMP\xff"
                              "SLEEP\xff"
                              "RADIANT\xff"
                              "CAPE SPIN\xff"
                              "OUTSIDE\xff"
                              "RETURN\xff"
                              "REPEL\xff"
                              "MUSHROOM\xff"
                              "SPINJUMP\xff");
//         set_text(rom, 0x8774, "REPEL");
    }
}